

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

bool cashew::JSPrinter::ifHasElse(Ref node)

{
  char cVar1;
  byte bVar2;
  Ref *pRVar3;
  Value *local_10;
  Ref node_local;
  
  local_10 = node.inst;
  if ((node.inst)->type == Array) {
    pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
    cVar1 = cashew::Ref::operator==(pRVar3,(IString *)&IF);
    if (cVar1 != '\0') {
      if (local_10->type == Array) {
        if ((((local_10->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
            usedElements < 4) {
          bVar2 = 0;
        }
        else {
          pRVar3 = (Ref *)cashew::Ref::operator[]((uint)&local_10);
          bVar2 = cashew::Ref::operator!(pRVar3);
          bVar2 = bVar2 ^ 1;
        }
        return (bool)bVar2;
      }
      __assert_fail("isArray()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                    ,0x19a,"size_t cashew::Value::size()");
    }
  }
  __assert_fail("node->isArray() && node[0] == IF",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x537,"static bool cashew::JSPrinter::ifHasElse(Ref)");
}

Assistant:

static bool ifHasElse(Ref node) {
    assert(node->isArray() && node[0] == IF);
    return node->size() >= 4 && !!node[3];
  }